

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

int __thiscall
capnp::SchemaLoader::BrandedInitializerImpl::init(BrandedInitializerImpl *this,EVP_PKEY_CTX *ctx)

{
  RawSchema *schema;
  int extraout_EAX;
  Own<capnp::SchemaLoader::Impl> *pOVar1;
  Impl *pIVar2;
  RawBrandedSchema ***pppRVar3;
  RawBrandedSchema *pRVar4;
  size_t sVar5;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> AVar6;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> local_b8;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_a8;
  undefined1 local_90 [8];
  ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> deps;
  Fault f;
  Fault local_70;
  SchemaBindingsPair local_68 [2];
  Maybe<capnp::_::RawBrandedSchema_*&> local_48;
  RawBrandedSchema **local_40;
  RawBrandedSchema **_kj_result;
  RawBrandedSchema *mutableSchema;
  undefined1 local_28 [8];
  Locked<kj::Own<capnp::SchemaLoader::Impl>_> lock;
  RawBrandedSchema *schema_local;
  BrandedInitializerImpl *this_local;
  
  lock.ptr = (Own<capnp::SchemaLoader::Impl> *)ctx;
  _::RawSchema::ensureInitialized(*(RawSchema **)ctx);
  kj::MutexGuarded<kj::Own<capnp::SchemaLoader::Impl>_>::lockExclusive
            ((MutexGuarded<kj::Own<capnp::SchemaLoader::Impl>_> *)local_28);
  if (lock.ptr[2].disposer == (Disposer *)0x0) {
    mutableSchema._4_4_ = 1;
  }
  else {
    pOVar1 = kj::Locked<kj::Own<capnp::SchemaLoader::Impl>_>::operator->
                       ((Locked<kj::Own<capnp::SchemaLoader::Impl>_> *)local_28);
    pIVar2 = kj::Own<capnp::SchemaLoader::Impl>::get(pOVar1);
    local_68[0].schema = (RawSchema *)(lock.ptr)->disposer;
    local_68[0].scopeBindings = (Scope *)(lock.ptr)->ptr;
    local_48 = kj::
               HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>
               ::find<capnp::(anonymous_namespace)::SchemaBindingsPair>(&pIVar2->brands,local_68);
    local_40 = kj::_::readMaybe<capnp::_::RawBrandedSchema*>(&local_48);
    if (local_40 == (RawBrandedSchema **)0x0) {
      kj::_::Debug::Fault::Fault
                (&local_70,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x793,FAILED,
                 "lock->get()->brands.find(SchemaBindingsPair { schema->generic, schema->scopes }) != nullptr"
                 ,"");
      kj::_::Debug::Fault::fatal(&local_70);
    }
    pppRVar3 = kj::mv<capnp::_::RawBrandedSchema**>(&local_40);
    _kj_result = (RawBrandedSchema **)**pppRVar3;
    if ((Own<capnp::SchemaLoader::Impl> *)_kj_result != lock.ptr) {
      kj::_::Debug::Fault::Fault
                ((Fault *)&deps.size_,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x794,FAILED,"mutableSchema == schema","");
      kj::_::Debug::Fault::fatal((Fault *)&deps.size_);
    }
    pOVar1 = kj::Locked<kj::Own<capnp::SchemaLoader::Impl>_>::operator->
                       ((Locked<kj::Own<capnp::SchemaLoader::Impl>_> *)local_28);
    pIVar2 = kj::Own<capnp::SchemaLoader::Impl>::get(pOVar1);
    schema = (RawSchema *)*_kj_result;
    local_b8 = kj::arrayPtr<capnp::_::RawBrandedSchema::Scope_const>
                         ((Scope *)_kj_result[1],(ulong)*(uint *)(_kj_result + 3));
    kj::Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>::Maybe(&local_a8,&local_b8);
    AVar6 = SchemaLoader::Impl::makeBrandedDependencies(pIVar2,schema,&local_a8);
    deps.ptr = (Dependency *)AVar6.size_;
    local_90 = (undefined1  [8])AVar6.ptr;
    kj::Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>::~Maybe(&local_a8);
    pRVar4 = (RawBrandedSchema *)
             kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency>::begin
                       ((ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> *)local_90);
    _kj_result[2] = pRVar4;
    sVar5 = kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency>::size
                      ((ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> *)local_90);
    *(int *)((long)_kj_result + 0x1c) = (int)sVar5;
    _kj_result[4] = (RawBrandedSchema *)0x0;
    mutableSchema._4_4_ = 0;
  }
  kj::Locked<kj::Own<capnp::SchemaLoader::Impl>_>::~Locked
            ((Locked<kj::Own<capnp::SchemaLoader::Impl>_> *)local_28);
  return extraout_EAX;
}

Assistant:

void SchemaLoader::BrandedInitializerImpl::init(const _::RawBrandedSchema* schema) const {
  schema->generic->ensureInitialized();

  auto lock = loader.impl.lockExclusive();

  if (schema->lazyInitializer == nullptr) {
    // Never mind, someone beat us to it.
    return;
  }

  // Get the mutable version.
  _::RawBrandedSchema* mutableSchema = KJ_ASSERT_NONNULL(
      lock->get()->brands.find(SchemaBindingsPair { schema->generic, schema->scopes }));
  KJ_ASSERT(mutableSchema == schema);

  // Construct its dependency map.
  auto deps = lock->get()->makeBrandedDependencies(mutableSchema->generic,
      kj::arrayPtr(mutableSchema->scopes, mutableSchema->scopeCount));
  mutableSchema->dependencies = deps.begin();
  mutableSchema->dependencyCount = deps.size();

  // It's initialized now, so disable the initializer.
#if __GNUC__
  __atomic_store_n(&mutableSchema->lazyInitializer, nullptr, __ATOMIC_RELEASE);
#elif _MSC_VER
  std::atomic_thread_fence(std::memory_order_release);
  *static_cast<_::RawBrandedSchema::Initializer const* volatile*>(
      &mutableSchema->lazyInitializer) = nullptr;
#else
#error "Platform not supported"
#endif
}